

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionShape.cpp
# Opt level: O2

void __thiscall
btCollisionShape::calculateTemporalAabb
          (btCollisionShape *this,btTransform *curTrans,btVector3 *linvel,btVector3 *angvel,
          btScalar timeStep,btVector3 *temporalAabbMin,btVector3 *temporalAabbMax)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  btScalar bVar6;
  float extraout_XMM0_Da;
  float fVar7;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dd;
  btVector3 bVar8;
  float local_84;
  btScalar local_7c;
  undefined1 local_78 [16];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  btVector3 local_40;
  
  local_7c = timeStep;
  (*this->_vptr_btCollisionShape[2])(this,curTrans,temporalAabbMin,temporalAabbMax);
  local_78 = ZEXT416((uint)temporalAabbMax->m_floats[2]);
  local_84 = temporalAabbMin->m_floats[2];
  local_58 = *(undefined8 *)temporalAabbMin->m_floats;
  uStack_50 = 0;
  local_68 = *(undefined8 *)temporalAabbMax->m_floats;
  uStack_60 = 0;
  bVar8 = operator*(linvel,&local_7c);
  fVar5 = bVar8.m_floats[0];
  fVar7 = bVar8.m_floats[1];
  uVar1 = -(uint)(0.0 < fVar5);
  uVar2 = -(uint)(0.0 < fVar7);
  uVar3 = -(uint)(0.0 < extraout_XMM0_Dc);
  uVar4 = -(uint)(0.0 < extraout_XMM0_Dd);
  local_58 = CONCAT44((uint)local_58._4_4_ & uVar2 | ~uVar2 & (uint)(fVar7 + local_58._4_4_),
                      (uint)(float)local_58 & uVar1 | ~uVar1 & (uint)(fVar5 + (float)local_58));
  uStack_50 = CONCAT44((uint)uStack_50._4_4_ & uVar4 |
                       ~uVar4 & (uint)(extraout_XMM0_Dd + uStack_50._4_4_),
                       (uint)(float)uStack_50 & uVar3 |
                       ~uVar3 & (uint)(extraout_XMM0_Dc + (float)uStack_50));
  local_68 = CONCAT44(~uVar2 & (uint)local_68._4_4_ | (uint)(local_68._4_4_ + fVar7) & uVar2,
                      ~uVar1 & (uint)(float)local_68 | (uint)((float)local_68 + fVar5) & uVar1);
  uStack_60 = CONCAT44(~uVar4 & (uint)uStack_60._4_4_ |
                       (uint)(uStack_60._4_4_ + extraout_XMM0_Dd) & uVar4,
                       ~uVar3 & (uint)(float)uStack_60 |
                       (uint)((float)uStack_60 + extraout_XMM0_Dc) & uVar3);
  fVar5 = bVar8.m_floats[2];
  if (fVar5 <= 0.0) {
    local_84 = local_84 + fVar5;
  }
  local_78._0_4_ =
       ~-(uint)(0.0 < fVar5) & local_78._0_4_ |
       (uint)((float)local_78._0_4_ + fVar5) & -(uint)(0.0 < fVar5);
  bVar6 = btVector3::length(angvel);
  (*this->_vptr_btCollisionShape[4])(this);
  local_40.m_floats[0] = extraout_XMM0_Da * bVar6 * local_7c;
  local_40.m_floats[3] = 0.0;
  *(undefined8 *)temporalAabbMin->m_floats = local_58;
  temporalAabbMin->m_floats[2] = local_84;
  temporalAabbMin->m_floats[3] = 0.0;
  *(undefined8 *)temporalAabbMax->m_floats = local_68;
  temporalAabbMax->m_floats[2] = (btScalar)local_78._0_4_;
  temporalAabbMax->m_floats[3] = 0.0;
  local_40.m_floats[1] = local_40.m_floats[0];
  local_40.m_floats[2] = local_40.m_floats[0];
  btVector3::operator-=(temporalAabbMin,&local_40);
  btVector3::operator+=(temporalAabbMax,&local_40);
  return;
}

Assistant:

void btCollisionShape::calculateTemporalAabb(const btTransform& curTrans,const btVector3& linvel,const btVector3& angvel,btScalar timeStep, btVector3& temporalAabbMin,btVector3& temporalAabbMax) const
{
	//start with static aabb
	getAabb(curTrans,temporalAabbMin,temporalAabbMax);

	btScalar temporalAabbMaxx = temporalAabbMax.getX();
	btScalar temporalAabbMaxy = temporalAabbMax.getY();
	btScalar temporalAabbMaxz = temporalAabbMax.getZ();
	btScalar temporalAabbMinx = temporalAabbMin.getX();
	btScalar temporalAabbMiny = temporalAabbMin.getY();
	btScalar temporalAabbMinz = temporalAabbMin.getZ();

	// add linear motion
	btVector3 linMotion = linvel*timeStep;
	///@todo: simd would have a vector max/min operation, instead of per-element access
	if (linMotion.x() > btScalar(0.))
		temporalAabbMaxx += linMotion.x(); 
	else
		temporalAabbMinx += linMotion.x();
	if (linMotion.y() > btScalar(0.))
		temporalAabbMaxy += linMotion.y(); 
	else
		temporalAabbMiny += linMotion.y();
	if (linMotion.z() > btScalar(0.))
		temporalAabbMaxz += linMotion.z(); 
	else
		temporalAabbMinz += linMotion.z();

	//add conservative angular motion
	btScalar angularMotion = angvel.length() * getAngularMotionDisc() * timeStep;
	btVector3 angularMotion3d(angularMotion,angularMotion,angularMotion);
	temporalAabbMin = btVector3(temporalAabbMinx,temporalAabbMiny,temporalAabbMinz);
	temporalAabbMax = btVector3(temporalAabbMaxx,temporalAabbMaxy,temporalAabbMaxz);

	temporalAabbMin -= angularMotion3d;
	temporalAabbMax += angularMotion3d;
}